

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_grow_map_(jit_State *J,MSize need)

{
  uint uVar1;
  SnapEntry *pSVar2;
  uint uVar3;
  
  uVar1 = J->sizesnapmap * 2;
  uVar3 = 0x40;
  if (0x40 < need) {
    uVar3 = need;
  }
  if (need < uVar1) {
    uVar3 = uVar1;
  }
  pSVar2 = (SnapEntry *)lj_mem_realloc(J->L,J->snapmapbuf,J->sizesnapmap << 2,uVar3 * 4);
  J->snapmapbuf = pSVar2;
  (J->cur).snapmap = pSVar2;
  J->sizesnapmap = uVar3;
  return;
}

Assistant:

void lj_snap_grow_map_(jit_State *J, MSize need)
{
  if (need < 2*J->sizesnapmap)
    need = 2*J->sizesnapmap;
  else if (need < 64)
    need = 64;
  J->snapmapbuf = (SnapEntry *)lj_mem_realloc(J->L, J->snapmapbuf,
		    J->sizesnapmap*sizeof(SnapEntry), need*sizeof(SnapEntry));
  J->cur.snapmap = J->snapmapbuf;
  J->sizesnapmap = need;
}